

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void CConsole::Con_EvalIf(IResult *pResult,void *pUserData)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_var;
  CCommand *pCVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar5;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  char *pcVar6;
  undefined8 uVar7;
  FCommandCallback p_Var8;
  void *pvVar9;
  long in_FS_OFFSET;
  bool bVar10;
  char aBuf [128];
  undefined1 local_1448 [1032];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined1 local_1030 [8];
  undefined8 local_1028;
  long local_30;
  
  local_1028 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar4 = FindCommand((CConsole *)pUserData,(char *)CONCAT44(extraout_var,iVar3),
                       *(int *)((long)pUserData + 0x10));
  if (pCVar4 == (CCommand *)0x0) {
    iVar3 = (*pResult->_vptr_IResult[4])(pResult,0);
    str_format(aBuf,0x80,"No such command: \'%s\'.",CONCAT44(extraout_var_01,iVar3));
    (**(code **)(*pUserData + 200))(pUserData,0,"console",aBuf,0);
    goto LAB_0012ae95;
  }
  pvVar9 = pCVar4->m_pUserData;
  p_Var8 = pCVar4->m_pfnCallback;
  while (p_Var8 == Con_Chain) {
    puVar1 = (undefined8 *)((long)pvVar9 + 8);
    pvVar9 = *(void **)((long)pvVar9 + 0x10);
    p_Var8 = (FCommandCallback)*puVar1;
  }
  aBuf[8] = '\0';
  aBuf[9] = '\0';
  aBuf[10] = '\0';
  aBuf[0xb] = '\0';
  aBuf._0_8_ = &PTR__IResult_00162798;
  mem_zero(local_1448,0x401);
  local_1040 = 0;
  uStack_1038 = 0;
  mem_zero(local_1030,0x1000);
  (*p_Var8)((IResult *)aBuf,pvVar9);
  uVar2 = aBuf._12_4_;
  if (p_Var8 == IntVariableCommand) {
    iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
    iVar3 = atoi((char *)CONCAT44(extraout_var_02,iVar3));
    bVar10 = uVar2 == iVar3;
  }
  else {
    iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
    iVar3 = str_comp_nocase(aBuf + 0x10,(char *)CONCAT44(extraout_var_00,iVar3));
    bVar10 = iVar3 == 0;
  }
  iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
  iVar3 = str_comp((char *)CONCAT44(extraout_var_03,iVar3),"!=");
  if (iVar3 == 0) {
    bVar10 = (bool)(bVar10 ^ 1);
  }
  else {
    iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
    iVar3 = str_comp((char *)CONCAT44(extraout_var_04,iVar3),"==");
    if ((p_Var8 == StrVariableCommand) && (iVar3 != 0)) {
      lVar5 = *pUserData;
      pcVar6 = "Error: invalid comperator for type string";
LAB_0012acaf:
      (**(code **)(lVar5 + 200))(pUserData,0,"console",pcVar6,0);
    }
    else {
      iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
      iVar3 = str_comp((char *)CONCAT44(extraout_var_05,iVar3),">");
      if (iVar3 == 0) {
        iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
        iVar3 = atoi((char *)CONCAT44(extraout_var_10,iVar3));
        bVar10 = iVar3 < (int)aBuf._12_4_;
      }
      else {
        iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
        iVar3 = str_comp((char *)CONCAT44(extraout_var_06,iVar3),"<");
        if (iVar3 == 0) {
          iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
          iVar3 = atoi((char *)CONCAT44(extraout_var_11,iVar3));
          bVar10 = (int)aBuf._12_4_ < iVar3;
        }
        else {
          iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
          iVar3 = str_comp((char *)CONCAT44(extraout_var_07,iVar3),"<=");
          if (iVar3 == 0) {
            iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
            iVar3 = atoi((char *)CONCAT44(extraout_var_12,iVar3));
            bVar10 = (int)aBuf._12_4_ <= iVar3;
          }
          else {
            iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
            iVar3 = str_comp((char *)CONCAT44(extraout_var_08,iVar3),">=");
            if (iVar3 == 0) {
              iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
              iVar3 = atoi((char *)CONCAT44(extraout_var_13,iVar3));
              bVar10 = iVar3 <= (int)aBuf._12_4_;
            }
            else {
              iVar3 = (*pResult->_vptr_IResult[4])(pResult,1);
              iVar3 = str_comp((char *)CONCAT44(extraout_var_09,iVar3),"==");
              if (iVar3 != 0) {
                lVar5 = *pUserData;
                pcVar6 = "Error: invalid comperator for type integer";
                goto LAB_0012acaf;
              }
            }
          }
        }
      }
    }
  }
  if (4 < (int)pResult->m_NumArgs) {
    iVar3 = (*pResult->_vptr_IResult[4])(pResult,4);
    iVar3 = str_comp((char *)CONCAT44(extraout_var_14,iVar3),"else");
    if (iVar3 != 0) {
      (**(code **)(*pUserData + 200))(pUserData,0,"console","Error: expected else",0);
    }
  }
  uVar7 = 3;
  if ((bVar10) || (uVar7 = 5, pResult->m_NumArgs == 6)) {
    iVar3 = (*pResult->_vptr_IResult[4])(pResult,uVar7);
    (**(code **)(*pUserData + 0x98))(pUserData,iVar3);
  }
LAB_0012ae95:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::Con_EvalIf(IResult *pResult, void *pUserData)
{
	CConsole *pConsole = static_cast<CConsole *>(pUserData);
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), pConsole->m_FlagMask);
	char aBuf[128];
	if(!pCommand)
	{
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		return;
	}
	FCommandCallback pfnCallback = pCommand->m_pfnCallback;
	void *pCallbackUserData = pCommand->m_pUserData;
	pConsole->TraverseChain(&pfnCallback, &pCallbackUserData);
	CResult Result;
	pfnCallback(&Result, pCallbackUserData);
	bool Condition = false;
	if(pfnCallback == IntVariableCommand)
		Condition = Result.m_Value == atoi(pResult->GetString(2));
	else
		Condition = !str_comp_nocase(Result.m_aValue, pResult->GetString(2));
	if(!str_comp(pResult->GetString(1), "!="))
		Condition = !Condition;
	else if(str_comp(pResult->GetString(1), "==") && pfnCallback == StrVariableCommand)
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: invalid comperator for type string");
	else if(!str_comp(pResult->GetString(1), ">"))
		Condition = Result.m_Value > atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), "<"))
		Condition = Result.m_Value < atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), "<="))
		Condition = Result.m_Value <= atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), ">="))
		Condition = Result.m_Value >= atoi(pResult->GetString(2));
	else if(str_comp(pResult->GetString(1), "=="))
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: invalid comperator for type integer");

	if(pResult->NumArguments() > 4 && str_comp(pResult->GetString(4), "else"))
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: expected else");

	if(Condition)
		pConsole->ExecuteLine(pResult->GetString(3));
	else if(pResult->NumArguments() == 6)
		pConsole->ExecuteLine(pResult->GetString(5));
}